

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

void * coll_seq_remove_at(coll_seq_t *seq,size_t index)

{
  coll_seq_node_t *__ptr;
  coll_seq_node_t *pcVar1;
  coll_seq_t *pcVar2;
  void *pvVar3;
  bool bVar4;
  
  if ((seq == (coll_seq_t *)0x0) || (seq->len <= index)) {
    pvVar3 = (void *)0x0;
  }
  else {
    pcVar1 = (coll_seq_node_t *)0x0;
    pcVar2 = seq;
    while( true ) {
      __ptr = pcVar2->head;
      bVar4 = index == 0;
      index = index - 1;
      if (bVar4) break;
      pcVar2 = (coll_seq_t *)&__ptr->next;
      pcVar1 = __ptr;
    }
    pcVar2 = (coll_seq_t *)&pcVar1->next;
    if (pcVar1 == (coll_seq_node_t *)0x0) {
      pcVar2 = seq;
    }
    pcVar2->head = __ptr->next;
    pvVar3 = __ptr->data;
    free(__ptr);
    seq->len = seq->len - 1;
  }
  return pvVar3;
}

Assistant:

void *coll_seq_remove_at(coll_seq_t *seq, size_t index) {
    if (!seq || index >= seq->len) {
        return NULL;
    }
    node_t *prev = NULL, *cur = seq->head;
    for (size_t i = 0; i < index; ++i) {
        prev = cur;
        cur = cur->next;
    }
    if (prev) {
        prev->next = cur->next;
    } else {
        seq->head = cur->next;
    }
    void *data = cur->data;
    free(cur);
    --(seq->len);
    return data;
}